

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathConvertString(xmlXPathObjectPtr val)

{
  xmlChar *local_20;
  xmlChar *res;
  xmlXPathObjectPtr val_local;
  
  local_20 = (xmlChar *)0x0;
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = xmlXPathNewCString("");
  }
  else {
    switch(val->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      local_20 = xmlXPathCastNodeSetToString(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      local_20 = xmlXPathCastBooleanToString(val->boolval);
      break;
    case XPATH_NUMBER:
      local_20 = xmlXPathCastNumberToString(val->floatval);
      break;
    case XPATH_STRING:
      return val;
    case XPATH_USERS:
    }
    xmlXPathFreeObject(val);
    if (local_20 == (xmlChar *)0x0) {
      val_local = xmlXPathNewCString("");
    }
    else {
      val_local = xmlXPathWrapString(local_20);
    }
  }
  return val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertString(xmlXPathObjectPtr val) {
    xmlChar *res = NULL;

    if (val == NULL)
	return(xmlXPathNewCString(""));

    switch (val->type) {
    case XPATH_UNDEFINED:
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	res = xmlXPathCastNodeSetToString(val->nodesetval);
	break;
    case XPATH_STRING:
	return(val);
    case XPATH_BOOLEAN:
	res = xmlXPathCastBooleanToString(val->boolval);
	break;
    case XPATH_NUMBER:
	res = xmlXPathCastNumberToString(val->floatval);
	break;
    case XPATH_USERS:
	/* TODO */
	break;
    }
    xmlXPathFreeObject(val);
    if (res == NULL)
	return(xmlXPathNewCString(""));
    return(xmlXPathWrapString(res));
}